

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Group::processPaintItems
          (Group *this,
          vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
          *list)

{
  bool bVar1;
  int iVar2;
  vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
  *list_00;
  reference ppOVar3;
  Paint *in_RSI;
  Group *in_RDI;
  Shape *pathItem;
  Object *content;
  reverse_iterator i;
  size_t curOpCount;
  undefined7 in_stack_ffffffffffffffb8;
  char in_stack_ffffffffffffffbf;
  Shape *in_stack_ffffffffffffffc8;
  Shape *this_00;
  Shape *this_01;
  size_t in_stack_ffffffffffffffe0;
  
  list_00 = (vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
             *)std::
               vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
               ::size((vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
                       *)in_RSI);
  std::
  vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
  ::rbegin((vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
            *)in_stack_ffffffffffffffc8);
  while( true ) {
    std::
    vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
    ::rend((vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>
            *)in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
                             *)in_RDI,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
    if (!bVar1) break;
    ppOVar3 = std::
              reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
              ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
                           *)in_RDI);
    this_00 = (Shape *)*ppOVar3;
    iVar2 = (*(this_00->super_Object)._vptr_Object[5])();
    in_stack_ffffffffffffffbf = (char)iVar2;
    if (in_stack_ffffffffffffffbf == '\x01') {
      processPaintItems((Group *)in_RSI,list_00);
    }
    else if (in_stack_ffffffffffffffbf == '\x02') {
      this_01 = this_00;
      Shape::setParent(this_00,in_RDI);
      std::
      vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
      ::push_back((vector<rlottie::internal::renderer::Shape_*,_std::allocator<rlottie::internal::renderer::Shape_*>_>
                   *)this_01,(value_type *)this_00);
      in_stack_ffffffffffffffc8 = this_00;
    }
    else if (in_stack_ffffffffffffffbf == '\x03') {
      Paint::addPathItems(in_RSI,list_00,in_stack_ffffffffffffffe0);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<rlottie::internal::renderer::Object_**,_std::vector<rlottie::internal::renderer::Object_*,_std::allocator<rlottie::internal::renderer::Object_*>_>_>_>
                  *)in_RDI);
  }
  return;
}

Assistant:

void renderer::Group::processPaintItems(std::vector<renderer::Shape *> &list)
{
    size_t curOpCount = list.size();
    for (auto i = mContents.rbegin(); i != mContents.rend(); ++i) {
        auto content = (*i);
        switch (content->type()) {
        case renderer::Object::Type::Shape: {
            auto pathItem = static_cast<renderer::Shape *>(content);
            pathItem->setParent(this);
            list.push_back(pathItem);
            break;
        }
        case renderer::Object::Type::Paint: {
            static_cast<renderer::Paint *>(content)->addPathItems(list,
                                                                  curOpCount);
            break;
        }
        case renderer::Object::Type::Group: {
            static_cast<renderer::Group *>(content)->processPaintItems(list);
            break;
        }
        default:
            break;
        }
    }
}